

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3-tiny.cpp
# Opt level: O2

void get_yolo_detections(yolo_layer *layer,vector<detection,_std::allocator<detection>_> *detections
                        ,int im_w,int im_h,int netw,int neth,float thresh)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  undefined4 uVar7;
  pointer pfVar5;
  pointer pfVar6;
  undefined1 auVar8 [16];
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  int j;
  int iVar16;
  ulong uVar17;
  long lVar18;
  int location;
  float fVar19;
  double dVar20;
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  float in_XMM4_Db;
  undefined1 auVar30 [16];
  float in_XMM5_Db;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  vector<detection,_std::allocator<detection>_> result;
  float fStack_104;
  float local_e8;
  value_type local_60;
  
  uVar4 = layer->w;
  uVar7 = layer->h;
  pfVar5 = (layer->predictions).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar13 = (ulong)((long)(layer->mask).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)(layer->mask).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start) >> 2;
  result.super__Vector_base<detection,_std::allocator<detection>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  result.super__Vector_base<detection,_std::allocator<detection>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  result.super__Vector_base<detection,_std::allocator<detection>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  iVar15 = uVar7 * uVar4;
  auVar8._4_4_ = (float)(int)uVar7;
  auVar8._0_4_ = (float)(int)uVar4;
  auVar25._0_4_ = (float)netw;
  auVar25._4_4_ = (float)neth;
  auVar28._4_4_ = auVar25._4_4_;
  auVar28._0_4_ = auVar25._0_4_;
  auVar22._0_4_ = (float)im_w;
  auVar22._4_4_ = (float)im_h;
  auVar22._8_8_ = 0;
  auVar28._8_8_ = 0;
  auVar22 = divps(auVar28,auVar22);
  uVar17 = 0;
  uVar14 = uVar13 & 0xffffffff;
  if ((int)uVar13 < 1) {
    uVar14 = uVar17;
  }
  iVar9 = 0;
  if (0 < iVar15) {
    iVar9 = iVar15;
  }
  fStack_104 = in_XMM4_Db;
  while (iVar16 = (int)uVar17, iVar16 != iVar9) {
    for (uVar13 = 0; uVar13 != uVar14; uVar13 = uVar13 + 1) {
      location = iVar15 * (int)uVar13 + iVar16;
      iVar10 = yolo_layer::entry_index(layer,location,4);
      fVar1 = pfVar5[iVar10];
      if (thresh < fVar1) {
        local_60.prob.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_60.prob.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_60.prob.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        iVar11 = yolo_layer::entry_index(layer,location,0);
        pfVar6 = (layer->predictions).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar10 = (layer->mask).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar13];
        fVar19 = pfVar6[iVar11];
        fVar2 = pfVar6[iVar15 + iVar11];
        dVar20 = exp((double)pfVar6[iVar15 * 2 + iVar11]);
        fVar3 = (layer->anchors).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start[(long)iVar10 * 2];
        dVar21 = exp((double)pfVar6[iVar15 * 3 + iVar11]);
        local_e8 = auVar22._0_4_;
        if (auVar22._4_4_ <= local_e8) {
          iVar11 = (neth * im_w) / im_h;
          uVar17 = CONCAT44(auVar25._4_4_,(float)iVar11);
          iVar12 = neth;
        }
        else {
          iVar12 = (netw * im_h) / im_w;
          uVar17 = CONCAT44((float)iVar12,auVar25._0_4_);
          fStack_104 = 0.0;
          iVar11 = netw;
        }
        auVar23._8_8_ = 0;
        auVar23._0_8_ = uVar17;
        auVar31._0_4_ = fVar19 + (float)(iVar16 % (int)uVar4);
        auVar31._4_4_ = fVar2 + (float)(iVar16 / (int)uVar4);
        auVar31._8_4_ = fStack_104 + 0.0;
        auVar31._12_4_ = in_XMM5_Db + 0.0;
        auVar8._8_8_ = 0;
        auVar32 = divps(auVar31,auVar8);
        auVar30._0_8_ = dVar20 * (double)fVar3;
        auVar30._8_8_ =
             dVar21 * (double)(layer->anchors).super__Vector_base<float,_std::allocator<float>_>.
                              _M_impl.super__Vector_impl_data._M_start[iVar10 * 2 + 1];
        auVar26._8_8_ = (double)neth;
        auVar26._0_8_ = (double)netw;
        in_XMM5_Db = (float)((ulong)(double)netw >> 0x20);
        auVar30 = divpd(auVar30,auVar26);
        fStack_104 = (float)(neth - iVar12);
        auVar27._0_8_ = (double)(netw - iVar11) * -0.5;
        auVar27._8_8_ = (double)(int)fStack_104 * -0.5;
        auVar28 = divpd(auVar27,auVar26);
        auVar29._0_8_ = auVar28._0_8_ + (double)auVar32._0_4_;
        auVar29._8_8_ = auVar28._8_8_ + (double)auVar32._4_4_;
        auVar25._8_8_ = 0;
        auVar26 = divps(auVar25,auVar23);
        auVar32._4_4_ = auVar25._4_4_;
        auVar32._0_4_ = auVar25._0_4_;
        auVar32._8_8_ = 0;
        auVar28 = divps(auVar23,auVar32);
        auVar24._0_8_ = (double)auVar28._0_4_;
        auVar24._8_8_ = (double)auVar28._4_4_;
        auVar28 = divpd(auVar29,auVar24);
        local_60.bbox.x = (float)auVar28._0_8_;
        local_60.bbox.y = (float)auVar28._8_8_;
        local_60.bbox.h = auVar26._4_4_ * (float)auVar30._8_8_;
        local_60.bbox.w = auVar26._0_4_ * (float)auVar30._0_8_;
        local_60.objectness = fVar1;
        std::vector<float,_std::allocator<float>_>::resize(&local_60.prob,(long)layer->classes);
        for (lVar18 = 0; lVar18 < layer->classes; lVar18 = lVar18 + 1) {
          iVar10 = yolo_layer::entry_index(layer,location,(int)lVar18 + 5);
          fVar19 = pfVar5[iVar10] * fVar1;
          local_60.prob.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start[lVar18] =
               (float)(-(uint)(thresh < fVar19) & (uint)fVar19);
        }
        std::vector<detection,_std::allocator<detection>_>::push_back(detections,&local_60);
        std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                  (&local_60.prob.super__Vector_base<float,_std::allocator<float>_>);
      }
    }
    uVar17 = (ulong)(iVar16 + 1);
  }
  std::vector<detection,_std::allocator<detection>_>::~vector(&result);
  return;
}

Assistant:

static void get_yolo_detections(const yolo_layer & layer, std::vector<detection> & detections, int im_w, int im_h, int netw, int neth, float thresh)
{
    int w = layer.w;
    int h = layer.h;
    int N = layer.mask.size();
    const float * predictions = layer.predictions.data();
    std::vector<detection> result;
    for (int i = 0; i < w*h; i++) {
        for (int n = 0; n < N; n++) {
            int obj_index = layer.entry_index(n*w*h + i, 4);
            float objectness = predictions[obj_index];
            if (objectness <= thresh) {
                continue;
            }
            detection det;
            int box_index = layer.entry_index(n*w*h + i, 0);
            int row = i / w;
            int col = i % w;
            det.bbox = get_yolo_box(layer, layer.mask[n], box_index, col, row, w, h, netw, neth, w*h);
            correct_yolo_box(det.bbox, im_w, im_h, netw, neth);
            det.objectness = objectness;
            det.prob.resize(layer.classes);
            for (int j = 0; j < layer.classes; j++) {
                int class_index = layer.entry_index(n*w*h + i, 4 + 1 + j);
                float prob = objectness*predictions[class_index];
                det.prob[j] = (prob > thresh) ? prob : 0;
            }
            detections.push_back(det);
        }
    }
}